

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O0

void TTD::NSSnapType::ParseSnapType
               (SnapType *sType,bool readSeparator,FileReader *reader,SlabAllocator *alloc,
               TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>
               *typeHandlerMap)

{
  TypeId TVar1;
  int iVar2;
  TTD_PTR_ID TVar3;
  TTD_LOG_PTR_ID TVar4;
  TTDVar pvVar5;
  SnapHandler **ppSVar6;
  FileReader *reader_00;
  TTD_PTR_ID handlerId;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*> *typeHandlerMap_local;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  bool readSeparator_local;
  SnapType *sType_local;
  
  (*reader->_vptr_FileReader[6])
            (reader,(ulong)readSeparator & 1,reader,
             CONCAT71((int7)((ulong)alloc >> 8),readSeparator) & 0xffffffffffffff01);
  TVar3 = FileReader::ReadAddr(reader,typeId,false);
  sType->TypePtrId = TVar3;
  TVar1 = FileReader::ReadTag<Js::TypeId>(reader,jsTypeId,true);
  sType->JsTypeId = TVar1;
  TVar4 = FileReader::ReadLogTag(reader,ctxTag,true);
  sType->ScriptContextLogId = TVar4;
  (*reader->_vptr_FileReader[3])(reader,0x29,1);
  pvVar5 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_00);
  sType->PrototypeVar = pvVar5;
  TVar3 = FileReader::ReadAddr(reader,handlerId,true);
  if (TVar3 == 0) {
    sType->TypeHandlerInfo = (SnapHandler *)0x0;
  }
  else {
    ppSVar6 = TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::
              LookupKnownItem(typeHandlerMap,TVar3);
    sType->TypeHandlerInfo = *ppSVar6;
  }
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  sType->HasNoEnumerableProperties = (bool)((byte)iVar2 & 1);
  (*reader->_vptr_FileReader[7])();
  return;
}

Assistant:

void ParseSnapType(SnapType* sType, bool readSeparator, FileReader* reader, SlabAllocator& alloc, const TTDIdentifierDictionary<TTD_PTR_ID, SnapHandler*>& typeHandlerMap)
        {
            reader->ReadRecordStart(readSeparator);

            sType->TypePtrId = reader->ReadAddr(NSTokens::Key::typeId);

            sType->JsTypeId = reader->ReadTag<Js::TypeId>(NSTokens::Key::jsTypeId, true);
            sType->ScriptContextLogId = reader->ReadLogTag(NSTokens::Key::ctxTag, true);

            reader->ReadKey(NSTokens::Key::prototypeVar, true);
            sType->PrototypeVar = NSSnapValues::ParseTTDVar(false, reader);

            TTD_PTR_ID handlerId = reader->ReadAddr(NSTokens::Key::handlerId, true);
            if(handlerId == TTD_INVALID_PTR_ID)
            {
                sType->TypeHandlerInfo = nullptr;
            }
            else
            {
                sType->TypeHandlerInfo = typeHandlerMap.LookupKnownItem(handlerId);
            }

            sType->HasNoEnumerableProperties = reader->ReadBool(NSTokens::Key::boolVal, true);

            reader->ReadRecordEnd();
        }